

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

void __thiscall kj::_::BTreeImpl::BTreeImpl(BTreeImpl *this)

{
  this->tree = (NodeUnion *)EMPTY_NODE;
  this->treeCapacity = 1;
  this->height = 0;
  this->freelistHead = 1;
  this->freelistSize = 0;
  this->beginLeaf = 0;
  this->endLeaf = 0;
  return;
}

Assistant:

BTreeImpl::BTreeImpl()
    : tree(const_cast<NodeUnion*>(&EMPTY_NODE)),
      treeCapacity(1),
      height(0),
      freelistHead(1),
      freelistSize(0),
      beginLeaf(0),
      endLeaf(0) {}